

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O2

TestCaseGroup * vkt::image::createImageQualifiersTests(TestContext *testCtx)

{
  image *this;
  TestCase *node;
  TestCaseGroup *pTVar1;
  TestNode *node_00;
  long lVar2;
  ImageType imageType;
  ImageType imageType_00;
  char *name;
  TextureFormat *extraout_RDX;
  TextureFormat *format;
  TextureFormat *extraout_RDX_00;
  int iVar3;
  long lVar4;
  ImageType IVar5;
  uint uVar6;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> qualifierGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTypeGroup;
  MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> restrictCase;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageQualifiersTests;
  UVec3 imageSize;
  string formatName;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"qualifiers","Coherent, volatile and restrict");
  imageQualifiersTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  .m_data.ptr = pTVar1;
  if (createImageQualifiersTests(tcu::TestContext&)::imageParamsArray == '\0') {
    iVar3 = __cxa_guard_acquire(&createImageQualifiersTests(tcu::TestContext&)::imageParamsArray);
    if (iVar3 != 0) {
      formatName._M_dataplus._M_p = (pointer)0x100000040;
      IVar5 = IMAGE_TYPE_1D_ARRAY;
      createImageQualifiersTests::imageParamsArray[0].m_imageType = IMAGE_TYPE_1D;
      formatName._M_string_length._0_4_ = IVar5;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[0].m_imageSize,
                 (Vector<unsigned_int,_3> *)&formatName);
      restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.ptr =
           (TestCase *)0x100000040;
      uVar6 = 8;
      createImageQualifiersTests::imageParamsArray[1].m_imageType = IVar5;
      restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data._8_4_
           = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[1].m_imageSize,
                 (Vector<unsigned_int,_3> *)&restrictCase);
      qualifierGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x4000000040;
      createImageQualifiersTests::imageParamsArray[2].m_imageType = IMAGE_TYPE_2D;
      qualifierGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = IVar5;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[2].m_imageSize,
                 (Vector<unsigned_int,_3> *)&qualifierGroup);
      imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data.ptr = (TestCaseGroup *)0x4000000040;
      createImageQualifiersTests::imageParamsArray[3].m_imageType = IMAGE_TYPE_2D_ARRAY;
      imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[3].m_imageSize,
                 (Vector<unsigned_int,_3> *)&imageTypeGroup);
      imageSize.m_data[0] = 0x40;
      imageSize.m_data[1] = 0x40;
      createImageQualifiersTests::imageParamsArray[4].m_imageType = IMAGE_TYPE_3D;
      imageSize.m_data[2] = uVar6;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[4].m_imageSize,&imageSize);
      local_54.m_data[0] = 0x40;
      local_54.m_data[1] = 0x40;
      createImageQualifiersTests::imageParamsArray[5].m_imageType = IMAGE_TYPE_CUBE;
      local_54.m_data[2] = IVar5;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[5].m_imageSize,&local_54);
      local_3c.m_data[0] = 0x40;
      local_3c.m_data[1] = 0x40;
      createImageQualifiersTests::imageParamsArray[6].m_imageType = IMAGE_TYPE_CUBE_ARRAY;
      local_3c.m_data[2] = IMAGE_TYPE_2D;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[6].m_imageSize,&local_3c);
      local_48.m_data[0] = 0x40;
      local_48.m_data[1] = 1;
      createImageQualifiersTests::imageParamsArray[7].m_imageType = IMAGE_TYPE_BUFFER;
      local_48.m_data[2] = IVar5;
      tcu::Vector<unsigned_int,_3>::Vector
                (&createImageQualifiersTests::imageParamsArray[7].m_imageSize,&local_48);
      __cxa_guard_release(&createImageQualifiersTests(tcu::TestContext&)::imageParamsArray);
    }
  }
  if (createImageQualifiersTests(tcu::TestContext&)::formats == '\0') {
    iVar3 = __cxa_guard_acquire(&createImageQualifiersTests(tcu::TestContext&)::formats);
    if (iVar3 != 0) {
      createImageQualifiersTests::formats[0].order = R;
      createImageQualifiersTests::formats[0].type = FLOAT;
      createImageQualifiersTests::formats[1].order = R;
      createImageQualifiersTests::formats[1].type = UNSIGNED_INT32;
      createImageQualifiersTests::formats[2].order = R;
      createImageQualifiersTests::formats[2].type = SIGNED_INT32;
      __cxa_guard_release(&createImageQualifiersTests(tcu::TestContext&)::formats);
    }
  }
  for (iVar3 = 0;
      pTVar1 = imageQualifiersTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, iVar3 != 3; iVar3 = iVar3 + 1) {
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    name = "restrict";
    if (iVar3 == 1) {
      name = "volatile";
    }
    if (iVar3 == 0) {
      name = "coherent";
    }
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,name,"");
    lVar2 = 0;
    qualifierGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar1;
    while( true ) {
      pTVar1 = qualifierGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      if (lVar2 == 8) break;
      IVar5 = createImageQualifiersTests::imageParamsArray[lVar2].m_imageType;
      tcu::Vector<unsigned_int,_3>::Vector
                (&imageSize,&createImageQualifiersTests::imageParamsArray[lVar2].m_imageSize);
      if (iVar3 == 2) {
        getImageTypeName_abi_cxx11_(&formatName,(image *)(ulong)IVar5,imageType);
        createImageQualifierRestrictCase
                  ((MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *)
                   &restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>
                   ,testCtx,IVar5,&formatName);
        std::__cxx11::string::~string((string *)&formatName);
        node = restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.
               m_data.ptr;
        restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>.m_data.ptr
             = (TestCase *)0x0;
        tcu::TestNode::addChild
                  (&(qualifierGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,(TestNode *)node);
        de::details::UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>::~UniqueBase
                  (&restrictCase.super_UniqueBase<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>
                  );
      }
      else {
        pTVar1 = (TestCaseGroup *)operator_new(0x70);
        getImageTypeName_abi_cxx11_(&formatName,(image *)(ulong)IVar5,imageType_00);
        tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,formatName._M_dataplus._M_p,"");
        imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
        .m_data.ptr = pTVar1;
        std::__cxx11::string::~string((string *)&formatName);
        format = extraout_RDX;
        for (lVar4 = 0;
            pTVar1 = imageTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr, lVar4 != 0x18; lVar4 = lVar4 + 8) {
          this = (image *)((long)&createImageQualifiersTests::formats[0].order + lVar4);
          getShaderImageFormatQualifier_abi_cxx11_(&formatName,this,format);
          pTVar1 = imageTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          node_00 = (TestNode *)operator_new(0x90);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&restrictCase,"",(allocator<char> *)&local_54);
          TestCase::TestCase((TestCase *)node_00,testCtx,&formatName,(string *)&restrictCase);
          node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_00c06c08;
          *(int *)&node_00[1]._vptr_TestNode = iVar3;
          *(ImageType *)((long)&node_00[1]._vptr_TestNode + 4) = IVar5;
          tcu::Vector<unsigned_int,_3>::Vector
                    ((Vector<unsigned_int,_3> *)&node_00[1].m_testCtx,&imageSize);
          *(undefined8 *)((long)&node_00[1].m_name._M_dataplus._M_p + 4) = *(undefined8 *)this;
          *(undefined4 *)((long)&node_00[1].m_name._M_string_length + 4) = 0xc;
          tcu::TestNode::addChild(&pTVar1->super_TestNode,node_00);
          std::__cxx11::string::~string((string *)&restrictCase);
          std::__cxx11::string::~string((string *)&formatName);
          format = extraout_RDX_00;
        }
        imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
        .m_data.ptr = (TestCaseGroup *)0x0;
        tcu::TestNode::addChild
                  (&(qualifierGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
        de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
        ~UniqueBase(&imageTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      }
      lVar2 = lVar2 + 1;
    }
    qualifierGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(imageQualifiersTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&qualifierGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  imageQualifiersTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  .m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&imageQualifiersTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createImageQualifiersTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> imageQualifiersTests(new tcu::TestCaseGroup(testCtx, "qualifiers", "Coherent, volatile and restrict"));

	struct ImageParams
	{
		ImageParams(const ImageType imageType, const tcu::UVec3& imageSize)
			: m_imageType	(imageType)
			, m_imageSize	(imageSize)
		{
		}
		ImageType	m_imageType;
		tcu::UVec3	m_imageSize;
	};

	static const ImageParams imageParamsArray[] =
	{
		ImageParams(IMAGE_TYPE_1D,			tcu::UVec3(64u, 1u,  1u)),
		ImageParams(IMAGE_TYPE_1D_ARRAY,	tcu::UVec3(64u, 1u,  8u)),
		ImageParams(IMAGE_TYPE_2D,			tcu::UVec3(64u, 64u, 1u)),
		ImageParams(IMAGE_TYPE_2D_ARRAY,	tcu::UVec3(64u, 64u, 8u)),
		ImageParams(IMAGE_TYPE_3D,			tcu::UVec3(64u, 64u, 8u)),
		ImageParams(IMAGE_TYPE_CUBE,		tcu::UVec3(64u, 64u, 1u)),
		ImageParams(IMAGE_TYPE_CUBE_ARRAY,	tcu::UVec3(64u, 64u, 2u)),
		ImageParams(IMAGE_TYPE_BUFFER,		tcu::UVec3(64u, 1u,  1u))
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::SIGNED_INT32),
	};

	for (deUint32 qualifierI = 0; qualifierI < MemoryQualifierTestCase::QUALIFIER_LAST; ++qualifierI)
	{
		const MemoryQualifierTestCase::Qualifier	memoryQualifier		= (MemoryQualifierTestCase::Qualifier)qualifierI;
		const char* const							memoryQualifierName =
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_COHERENT ? "coherent" :
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_VOLATILE ? "volatile" :
			memoryQualifier == MemoryQualifierTestCase::QUALIFIER_RESTRICT ? "restrict" :
			DE_NULL;

		de::MovePtr<tcu::TestCaseGroup> qualifierGroup(new tcu::TestCaseGroup(testCtx, memoryQualifierName, ""));

		for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParamsArray); imageTypeNdx++)
		{
			const ImageType		imageType = imageParamsArray[imageTypeNdx].m_imageType;
			const tcu::UVec3	imageSize = imageParamsArray[imageTypeNdx].m_imageSize;

			if (memoryQualifier == MemoryQualifierTestCase::QUALIFIER_RESTRICT)
			{
				de::MovePtr<TestCase> restrictCase = createImageQualifierRestrictCase(testCtx, imageType, getImageTypeName(imageType));
				qualifierGroup->addChild(restrictCase.release());
			}
			else
			{
				de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(imageType).c_str(), ""));

				for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const tcu::TextureFormat&	format		= formats[formatNdx];
					const std::string			formatName	= getShaderImageFormatQualifier(formats[formatNdx]);

					imageTypeGroup->addChild(
						new MemoryQualifierTestCase(testCtx, formatName, "", memoryQualifier, imageType, imageSize, format, glu::GLSL_VERSION_440));
				}

				qualifierGroup->addChild(imageTypeGroup.release());
			}
		}

		imageQualifiersTests->addChild(qualifierGroup.release());
	}

	return imageQualifiersTests.release();
}